

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

unicode * __thiscall
dpfb::unicode::utf16ToUtf8_abi_cxx11_(unicode *this,char16_t *begin,char16_t *end)

{
  char16_t cVar1;
  bool bVar2;
  char *out;
  char16_t *pcVar3;
  size_t seqIdx;
  char32_t local_40;
  char32_t cp2;
  char32_t cp;
  size_t resultLen;
  char16_t *end_local;
  char16_t *begin_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  end_local = begin;
  if (begin < end) {
    std::__cxx11::string::reserve((ulong)this);
  }
  while (end_local < end) {
    pcVar3 = end_local + 1;
    local_40 = (char32_t)(ushort)*end_local;
    bVar2 = isLeadingSurrogate(local_40);
    if ((bVar2) && (pcVar3 < end)) {
      cVar1 = *pcVar3;
      bVar2 = isTrailingSurrogate((uint)(ushort)cVar1);
      pcVar3 = end_local + 2;
      if (bVar2) {
        local_40 = combineSurrogates(local_40,(uint)(ushort)cVar1);
      }
    }
    end_local = pcVar3;
    utf8Length(local_40);
    std::__cxx11::string::resize((ulong)this);
    out = (char *)std::__cxx11::string::operator[]((ulong)this);
    encodeUtf8(local_40,out);
  }
  return this;
}

Assistant:

std::string utf16ToUtf8(const char16_t* begin, const char16_t* end)
{
    std::string result;
    std::size_t resultLen = 0;

    if (begin < end)
        result.reserve(end - begin);

    while (begin < end) {
        char32_t cp = *begin++;
        // A lone surrogate is handled by utf8Length() and
        // encodeUtf8(), so we don't have to set cp to replacement
        // character.
        if (isLeadingSurrogate(cp) && begin < end) {
            const char32_t cp2 = *begin++;
            if (isTrailingSurrogate(cp2))
                cp = combineSurrogates(cp, cp2);
        }

        const auto seqIdx = resultLen;
        resultLen += utf8Length(cp);
        result.resize(resultLen);
        encodeUtf8(cp, &result[seqIdx]);
    }

    return result;
}